

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall PSEngine::next_subturn(PSEngine *this)

{
  bool bVar1;
  element_type *peVar2;
  vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_> *pvVar3;
  string local_258;
  string local_238 [32];
  string local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [32];
  reference local_1b8;
  Rule *rule_1;
  iterator __end2;
  iterator __begin2;
  vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_> *__range2;
  string local_190 [32];
  string local_170 [32];
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  reference local_f0;
  Rule *rule;
  iterator __end1;
  iterator __begin1;
  vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_> *__range1;
  SubturnHistory local_a8;
  undefined1 local_90 [8];
  Level last_subturn_save;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  PSEngine *local_10;
  PSEngine *this_local;
  
  local_10 = this;
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_30,(string *)&m_engine_log_cat_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"--- Subturn start ---",&local_51);
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_30,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::string::~string(local_30);
  }
  Level::Level((Level *)local_90,&this->m_current_level);
  local_a8.steps.super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.steps.super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.steps.super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubturnHistory::SubturnHistory(&local_a8);
  std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::push_back
            (&(this->m_turn_history).subturns,&local_a8);
  SubturnHistory::~SubturnHistory(&local_a8);
  Level::Level((Level *)&__range1,&this->m_current_level);
  ObjectCache::build_cache(&this->m_object_cache,(Level *)&__range1);
  Level::~Level((Level *)&__range1);
  pvVar3 = &(this->m_compiled_game).rules;
  __end1 = std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>::begin(pvVar3);
  rule = (Rule *)std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>::end(pvVar3);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
                                *)&rule);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
               ::operator*(&__end1);
    if ((int)(this->m_config).log_verbosity < 3) {
      peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_110,(string *)&m_engine_log_cat_abi_cxx11_);
      CompiledGame::Rule::to_string_abi_cxx11_(&local_150,local_f0,false);
      std::operator+(&local_130,"Processing rule : ",&local_150);
      (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_110,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string(local_110);
    }
    apply_rule(this,local_f0);
    __gnu_cxx::
    __normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
    ::operator++(&__end1);
  }
  bVar1 = resolve_movements(this);
  if (!bVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/KerDelos[P]Psionic/src/PSEngine.cpp"
                  ,0x14c,"bool PSEngine::next_subturn()");
  }
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_170,(string *)&m_engine_log_cat_abi_cxx11_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_190,"movement resolved",(allocator<char> *)((long)&__range2 + 7));
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_170,local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    std::__cxx11::string::~string(local_170);
  }
  pvVar3 = &(this->m_compiled_game).late_rules;
  __end2 = std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>::begin(pvVar3);
  rule_1 = (Rule *)std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>::end(pvVar3)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
                                *)&rule_1);
    if (!bVar1) break;
    local_1b8 = __gnu_cxx::
                __normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
                ::operator*(&__end2);
    if ((int)(this->m_config).log_verbosity < 3) {
      peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_1d8,(string *)&m_engine_log_cat_abi_cxx11_);
      CompiledGame::Rule::to_string_abi_cxx11_(&local_218,local_1b8,false);
      std::operator+(&local_1f8,"Processing late rule : ",&local_218);
      (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_1d8,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string(local_1d8);
    }
    apply_rule(this,local_1b8);
    __gnu_cxx::
    __normal_iterator<CompiledGame::Rule_*,_std::vector<CompiledGame::Rule,_std::allocator<CompiledGame::Rule>_>_>
    ::operator++(&__end2);
  }
  if ((int)(this->m_config).log_verbosity < 3) {
    peVar2 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_238,(string *)&m_engine_log_cat_abi_cxx11_);
    ObjectCache::to_string_abi_cxx11_(&local_258,&this->m_object_cache);
    (*peVar2->_vptr_PSLogger[2])(peVar2,2,local_238,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string(local_238);
  }
  Level::~Level((Level *)local_90);
  return true;
}

Assistant:

bool PSEngine::next_subturn()
{
    PS_LOG("--- Subturn start ---");
    Level last_subturn_save = m_current_level;

    m_turn_history.subturns.push_back(SubturnHistory());

    m_object_cache.build_cache(m_current_level);

    for(const auto& rule : m_compiled_game.rules)
    {
        PS_LOG("Processing rule : " + rule.to_string());
        apply_rule(rule);
    }

    if( !resolve_movements() )
    {
        //todo : for now, movement should always successfully resolve
        //need to decide what to do and add in the history if a movement phase can be considered as unresolved
        //(ie: in puzzlescript there's an option to cancel the whole turn if the player cannot move for example)
        assert(false);
        /*PS_LOG("could not resolve movement, cancelling the turn.");
        m_current_level = last_subturn_save;
        m_turn_history.pop_back();*/
        return false;
    }
    else
    {
        PS_LOG("movement resolved");

        for(const auto& rule : m_compiled_game.late_rules)
        {
            PS_LOG("Processing late rule : " + rule.to_string());
            apply_rule(rule);
        }

        PS_LOG(m_object_cache.to_string());

        return true;
    }
}